

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodeCalcTabBarLayout
               (ImGuiDockNode *node,ImRect *out_title_rect,ImRect *out_tab_bar_rect,
               ImVec2 *out_window_menu_button_pos,ImVec2 *out_close_button_pos)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiContext_conflict1 *pIVar4;
  ImVec2 IVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  pIVar4 = GImGui;
  fVar6 = (node->Pos).x;
  fVar1 = (node->Pos).y;
  fVar7 = (node->Size).x + fVar6;
  fVar8 = (GImGui->Style).FramePadding.y;
  fVar8 = fVar8 + fVar8 + GImGui->FontSize + fVar1;
  if (out_title_rect != (ImRect *)0x0) {
    (out_title_rect->Min).x = fVar6;
    (out_title_rect->Min).y = fVar1;
    (out_title_rect->Max).x = fVar7;
    (out_title_rect->Max).y = fVar8;
  }
  fVar2 = (pIVar4->Style).WindowBorderSize;
  fVar9 = (pIVar4->Style).FramePadding.x;
  fVar6 = fVar6 + fVar2;
  fVar3 = pIVar4->FontSize;
  fVar7 = (fVar7 - fVar2) - fVar9;
  if (((node->field_0xbd & 8) != 0) &&
     (fVar7 = fVar7 - fVar3, out_close_button_pos != (ImVec2 *)0x0)) {
    out_close_button_pos->x = fVar7 - fVar9;
    out_close_button_pos->y = fVar1;
  }
  fVar9 = fVar9 + fVar6;
  if ((*(uint *)&node->field_0xbc >> 0xc & 1) != 0) {
    if ((pIVar4->Style).WindowMenuButtonPosition == 0) {
      fVar9 = fVar9 + fVar3 + (pIVar4->Style).ItemInnerSpacing.x;
    }
    else if (((*(uint *)&node->field_0xbc >> 0xc & 1) != 0) &&
            ((pIVar4->Style).WindowMenuButtonPosition == 1)) {
      fVar6 = fVar7 - (fVar3 + (pIVar4->Style).FramePadding.x);
      fVar7 = fVar6;
    }
  }
  if (out_tab_bar_rect != (ImRect *)0x0) {
    (out_tab_bar_rect->Min).x = fVar9;
    (out_tab_bar_rect->Min).y = fVar1;
    (out_tab_bar_rect->Max).x = fVar7;
    (out_tab_bar_rect->Max).y = fVar8;
  }
  if (out_window_menu_button_pos != (ImVec2 *)0x0) {
    IVar5.y = fVar1;
    IVar5.x = fVar6;
    *out_window_menu_button_pos = IVar5;
  }
  return;
}

Assistant:

static void ImGui::DockNodeCalcTabBarLayout(const ImGuiDockNode* node, ImRect* out_title_rect, ImRect* out_tab_bar_rect, ImVec2* out_window_menu_button_pos, ImVec2* out_close_button_pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;

    ImRect r = ImRect(node->Pos.x, node->Pos.y, node->Pos.x + node->Size.x, node->Pos.y + g.FontSize + g.Style.FramePadding.y * 2.0f);
    if (out_title_rect) { *out_title_rect = r; }

    r.Min.x += style.WindowBorderSize;
    r.Max.x -= style.WindowBorderSize;

    float button_sz = g.FontSize;

    ImVec2 window_menu_button_pos = r.Min;
    r.Min.x += style.FramePadding.x;
    r.Max.x -= style.FramePadding.x;
    if (node->HasCloseButton)
    {
        r.Max.x -= button_sz;
        if (out_close_button_pos) *out_close_button_pos = ImVec2(r.Max.x - style.FramePadding.x, r.Min.y);
    }
    if (node->HasWindowMenuButton && style.WindowMenuButtonPosition == ImGuiDir_Left)
    {
        r.Min.x += button_sz + style.ItemInnerSpacing.x;
    }
    else if (node->HasWindowMenuButton && style.WindowMenuButtonPosition == ImGuiDir_Right)
    {
        r.Max.x -= button_sz + style.FramePadding.x;
        window_menu_button_pos = ImVec2(r.Max.x, r.Min.y);
    }
    if (out_tab_bar_rect) { *out_tab_bar_rect = r; }
    if (out_window_menu_button_pos) { *out_window_menu_button_pos = window_menu_button_pos; }
}